

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O3

ssize_t Curl_send_plain(connectdata *conn,int num,void *mem,size_t len,CURLcode *code)

{
  undefined1 *puVar1;
  int err;
  Curl_easy *data;
  ssize_t sVar2;
  int *piVar3;
  char *pcVar4;
  char buffer [128];
  char acStack_a8 [136];
  
  if (((conn->bits).field_0x7 & 8) == 0) {
    sVar2 = send(conn->sock[num],mem,len,0x4000);
  }
  else {
    sVar2 = sendto(conn->sock[num],mem,len,0x20000000,(sockaddr *)conn->ip_addr->ai_addr,
                   conn->ip_addr->ai_addrlen);
    puVar1 = &(conn->bits).field_0x7;
    *puVar1 = *puVar1 & 0xf7;
  }
  *code = CURLE_OK;
  if (sVar2 == -1) {
    piVar3 = __errno_location();
    err = *piVar3;
    if (((err == 4) || (err == 0x73)) || (err == 0xb)) {
      *code = CURLE_AGAIN;
      sVar2 = 0;
    }
    else {
      data = conn->data;
      pcVar4 = Curl_strerror(err,acStack_a8,0x80);
      Curl_failf(data,"Send failure: %s",pcVar4);
      (conn->data->state).os_errno = err;
      *code = CURLE_SEND_ERROR;
      sVar2 = -1;
    }
  }
  return sVar2;
}

Assistant:

ssize_t Curl_send_plain(struct connectdata *conn, int num,
                        const void *mem, size_t len, CURLcode *code)
{
  curl_socket_t sockfd = conn->sock[num];
  ssize_t bytes_written;
  /* WinSock will destroy unread received data if send() is
     failed.
     To avoid lossage of received data, recv() must be
     performed before every send() if any incoming data is
     available. */
  pre_receive_plain(conn, num);

#if defined(MSG_FASTOPEN) && !defined(TCP_FASTOPEN_CONNECT) /* Linux */
  if(conn->bits.tcp_fastopen) {
    bytes_written = sendto(sockfd, mem, len, MSG_FASTOPEN,
                           conn->ip_addr->ai_addr, conn->ip_addr->ai_addrlen);
    conn->bits.tcp_fastopen = FALSE;
  }
  else
#endif
    bytes_written = swrite(sockfd, mem, len);

  *code = CURLE_OK;
  if(-1 == bytes_written) {
    int err = SOCKERRNO;

    if(
#ifdef WSAEWOULDBLOCK
      /* This is how Windows does it */
      (WSAEWOULDBLOCK == err)
#else
      /* errno may be EWOULDBLOCK or on some systems EAGAIN when it returned
         due to its inability to send off data without blocking. We therefore
         treat both error codes the same here */
      (EWOULDBLOCK == err) || (EAGAIN == err) || (EINTR == err) ||
      (EINPROGRESS == err)
#endif
      ) {
      /* this is just a case of EWOULDBLOCK */
      bytes_written = 0;
      *code = CURLE_AGAIN;
    }
    else {
      char buffer[STRERROR_LEN];
      failf(conn->data, "Send failure: %s",
            Curl_strerror(err, buffer, sizeof(buffer)));
      conn->data->state.os_errno = err;
      *code = CURLE_SEND_ERROR;
    }
  }
  return bytes_written;
}